

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O2

void __thiscall
btHashMap<btHashKey<btTriIndex>,_btTriIndex>::clear
          (btHashMap<btHashKey<btTriIndex>,_btTriIndex> *this)

{
  btAlignedObjectArray<int>::clear(&this->m_hashTable);
  btAlignedObjectArray<int>::clear(&this->m_next);
  btAlignedObjectArray<btTriIndex>::clear(&this->m_valueArray);
  btAlignedObjectArray<btHashKey<btTriIndex>_>::clear(&this->m_keyArray);
  return;
}

Assistant:

void	clear()
	{
		m_hashTable.clear();
		m_next.clear();
		m_valueArray.clear();
		m_keyArray.clear();
	}